

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.cpp
# Opt level: O2

bool __thiscall miniros::Transport::isHostAllowed(Transport *this,string *host)

{
  __type_conflict _Var1;
  pointer __rhs;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->only_localhost_allowed_ == true) {
    if (3 < host->_M_string_length) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)host);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"127.",&local_71);
      _Var1 = std::operator==(&local_70,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      if (_Var1) {
        return true;
      }
    }
    __rhs = (this->allowed_hosts_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (__rhs == (this->allowed_hosts_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (isHostAllowed::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,"miniros.unknown_package",(allocator<char> *)&local_50);
          console::initializeLogLocation(&isHostAllowed::loc,&local_70,Warn);
          std::__cxx11::string::~string((string *)&local_70);
        }
        if (isHostAllowed::loc.level_ != Warn) {
          console::setLogLocationLevel(&isHostAllowed::loc,Warn);
          console::checkLogLocationEnabled(&isHostAllowed::loc);
        }
        if (isHostAllowed::loc.logger_enabled_ != true) {
          return false;
        }
        console::print((FilterBase *)0x0,isHostAllowed::loc.logger_,isHostAllowed::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport.cpp"
                       ,0x81,"bool miniros::Transport::isHostAllowed(const std::string &) const",
                       "ROS_HOSTNAME / ROS_IP is set to only allow local connections, so a requested connection to \'%s\' is being rejected."
                       ,(host->_M_dataplus)._M_p);
        return false;
      }
      _Var1 = std::operator==(host,__rhs);
      __rhs = __rhs + 1;
    } while (!_Var1);
  }
  return true;
}

Assistant:

bool Transport::isHostAllowed(const std::string &host) const
{
  if (!only_localhost_allowed_)
    return true; // doesn't matter; we'll connect to anybody

  if (host.length() >= 4 && host.substr(0, 4) == std::string("127."))
    return true; // ipv4 localhost
  // now, loop through the list of valid hostnames and see if we find it
  for (std::vector<std::string>::const_iterator it = allowed_hosts_.begin(); 
       it != allowed_hosts_.end(); ++it)
  {
    if (host == *it)
      return true; // hooray
  }
  MINIROS_WARN("ROS_HOSTNAME / ROS_IP is set to only allow local connections, so "
           "a requested connection to '%s' is being rejected.", host.c_str());
  return false; // sadness
}